

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

example * VW::import_example(vw *all,string *label,primitive_feature_space *features,size_t len)

{
  uint64_t *puVar1;
  example *peVar2;
  vw *pvVar3;
  example *peVar4;
  size_t i;
  size_t sVar5;
  long lVar6;
  size_t j;
  ulong uVar7;
  uchar index;
  example *local_68;
  vw *local_60;
  size_t local_58;
  string local_50;
  
  local_58 = len;
  peVar4 = get_unused_example(all);
  local_68 = peVar4;
  (*(all->p->lp).default_label)(&peVar4->l);
  if (label->_M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_50,(string *)label);
    parse_example_label(all,local_68,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  local_60 = all;
  for (sVar5 = 0; pvVar3 = local_60, peVar2 = local_68, sVar5 != local_58; sVar5 = sVar5 + 1) {
    index = features[sVar5].name;
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)local_68,&index);
    lVar6 = 8;
    for (uVar7 = 0; uVar7 < features[sVar5].len; uVar7 = uVar7 + 1) {
      ::features::push_back
                ((peVar4->super_example_predict).feature_space + index,
                 *(feature_value *)((long)features[sVar5].fs + lVar6 + -8),
                 *(feature_index *)((long)&(features[sVar5].fs)->x + lVar6));
      lVar6 = lVar6 + 0x10;
    }
  }
  setup_example(local_60,local_68);
  puVar1 = &pvVar3->p->end_parsed_examples;
  *puVar1 = *puVar1 + 1;
  return peVar2;
}

Assistant:

example* import_example(vw& all, string label, primitive_feature_space* features, size_t len)
{
  example* ret = &get_unused_example(&all);
  all.p->lp.default_label(&ret->l);

  if (label.length() > 0)
    parse_example_label(all, *ret, label);

  for (size_t i = 0; i < len; i++)
  {
    unsigned char index = features[i].name;
    ret->indices.push_back(index);
    for (size_t j = 0; j < features[i].len; j++)
      ret->feature_space[index].push_back(features[i].fs[j].x, features[i].fs[j].weight_index);
  }

  setup_example(all, ret);
  all.p->end_parsed_examples++;
  return ret;
}